

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O1

StatementMap * Js::FunctionBody::StatementMap::New(Recycler *recycler)

{
  Recycler *alloc;
  StatementMap *pSVar1;
  undefined1 local_30 [8];
  TrackAllocData data;
  
  local_30 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2ad21b9;
  data.filename._0_4_ = 0x7bb;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_30);
  pSVar1 = (StatementMap *)new<Memory::Recycler>(0x14,alloc,0x38bbb2);
  (pSVar1->sourceSpan).begin = 0;
  (pSVar1->sourceSpan).end = 0;
  (pSVar1->byteCodeSpan).begin = 0;
  (pSVar1->byteCodeSpan).end = 0;
  pSVar1->isSubexpression = false;
  return pSVar1;
}

Assistant:

static StatementMap * New(Recycler* recycler)
                {
                    return RecyclerNew(recycler, StatementMap);
                }